

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCullDistanceTests.cpp
# Opt level: O0

void __thiscall glcts::CullDistance::FunctionalTest::readTexturePixels(FunctionalTest *this)

{
  GLuint GVar1;
  GLuint GVar2;
  code *pcVar3;
  int iVar4;
  deUint32 err;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  reference pvVar6;
  Functions *gl;
  FunctionalTest *this_local;
  
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar4 = (*pRVar5->_vptr_RenderContext[3])();
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::clear(&this->m_to_pixel_data_cache);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (&this->m_to_pixel_data_cache,(ulong)(this->m_to_width * this->m_to_height * 4));
  pcVar3 = *(code **)(CONCAT44(extraout_var,iVar4) + 0x1220);
  GVar1 = this->m_to_width;
  GVar2 = this->m_to_height;
  pvVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                     (&this->m_to_pixel_data_cache,0);
  (*pcVar3)(0,0,GVar1,GVar2,0x1908,0x1403,pvVar6);
  err = (**(code **)(CONCAT44(extraout_var,iVar4) + 0x800))();
  glu::checkError(err,"glReadPixels() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                  ,0xb41);
  return;
}

Assistant:

void CullDistance::FunctionalTest::readTexturePixels()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	m_to_pixel_data_cache.clear();

	m_to_pixel_data_cache.resize(m_to_width * m_to_height * m_to_pixel_data_cache_color_components);

	/* Read vertex from texture */
	gl.readPixels(0,		   /* x      */
				  0,		   /* y      */
				  m_to_width,  /* width  */
				  m_to_height, /* height */
				  GL_RGBA, GL_UNSIGNED_SHORT, &m_to_pixel_data_cache[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels() call failed.");
}